

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.c
# Opt level: O0

void gen_expr(_node_t *node)

{
  int *in_RDI;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  
  if (*in_RDI == 0x86) {
    fprintf((FILE *)f,"        ld      bc, %s\n",in_RDI + 9);
    fprintf((FILE *)f,"        ld      a, [bc]\n");
  }
  else if (*in_RDI == 0x87) {
    fprintf((FILE *)f,"; load constant\n");
    if (in_RDI[8] == 0) {
      fprintf((FILE *)f,"        xor     a\n");
    }
    else {
      fprintf((FILE *)f,"        ld      a, $%02X\n",(ulong)(uint)in_RDI[8]);
    }
  }
  else if (in_RDI[1] == 4) {
    gen_expr((_node_t *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
    if (*in_RDI == 0x8c) {
      fprintf((FILE *)f,"; negative (8 bits)\n");
      fprintf((FILE *)f,"        cpl\n");
      fprintf((FILE *)f,"        inc     a\n");
    }
  }
  else if (in_RDI[1] == 3) {
    gen_expr((_node_t *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
    fprintf((FILE *)f,"        push    af\n");
    gen_expr((_node_t *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
    switch(*in_RDI) {
    case 0x25:
      fprintf((FILE *)f,"; modulo \n");
      fprintf((FILE *)f,"        pop     de\n");
      fprintf((FILE *)f,"        ld      e, a\n");
      fprintf((FILE *)f,"        call    ___div_u8_\n");
      break;
    case 0x2a:
      fprintf((FILE *)f,"; multiplication \n");
      fprintf((FILE *)f,"        pop     de\n");
      fprintf((FILE *)f,"        ld      e, d\n");
      fprintf((FILE *)f,"        ld      h, a\n");
      fprintf((FILE *)f,"        call    ___mul_8_\n");
      fprintf((FILE *)f,"        ld      a, l\n");
      break;
    case 0x2b:
      fprintf((FILE *)f,"; addition \n");
      fprintf((FILE *)f,"        pop     de\n");
      fprintf((FILE *)f,"        add     a, d\n");
      break;
    case 0x2d:
      fprintf((FILE *)f,"; substraction \n");
      fprintf((FILE *)f,"        ld      d, a\n");
      fprintf((FILE *)f,"        pop     af\n");
      fprintf((FILE *)f,"        sub     a, d\n");
      break;
    case 0x2f:
      fprintf((FILE *)f,"; division \n");
      fprintf((FILE *)f,"        pop     de\n");
      fprintf((FILE *)f,"        ld      e, a\n");
      fprintf((FILE *)f,"        call    ___div_u8_\n");
      fprintf((FILE *)f,"        ld      a, d\n");
    }
  }
  else if (in_RDI[1] == 5) {
    gen_assign((_node_t *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  }
  return;
}

Assistant:

void gen_expr(_node_t* node)
{
    if (node->id == IDENTIFIER)
    {
        TODO("check existing ");
        fprintf(f, "        ld      bc, %s\n", node->identifier);
        fprintf(f, "        ld      a, [bc]\n"); /* 8-bits only */
    }
    else if (node->id == CONSTANT)
    {
        fprintf(f, "; load constant\n");
        if (!node->num_value)
            fprintf(f, "        xor     a\n");
        else
            fprintf(f, "        ld      a, $%02X\n", node->num_value);
    }
    else if (node->type == UNOP)
    {
        gen_expr(node->children[0]);

        switch(node->id)
        {
        case POSITIVE:
            break;

        case NEGATIVE:
            fprintf(f, "; negative (8 bits)\n");
            fprintf(f, "        cpl\n");
            fprintf(f, "        inc     a\n");
            break;
        }
    }
    else if (node->type == BINOP)
    {
        gen_expr(node->children[LEFTOP]);
        fprintf(f, "        push    af\n");
        gen_expr(node->children[RIGHTOP]);
        switch(node->id)
        {

        case '+':
            fprintf(f, "; addition \n");
            fprintf(f, "        pop     de\n");
            fprintf(f, "        add     a, d\n");
            break;

        case '-':
            fprintf(f, "; substraction \n");
            fprintf(f, "        ld      d, a\n");
            fprintf(f, "        pop     af\n");
            fprintf(f, "        sub     a, d\n");
            break;

        case '*':
            fprintf(f, "; multiplication \n");
            fprintf(f, "        pop     de\n");
            fprintf(f, "        ld      e, d\n");
            fprintf(f, "        ld      h, a\n");
            fprintf(f, "        call    ___mul_8_\n");
            fprintf(f, "        ld      a, l\n");
            break;

        case '/':
            fprintf(f, "; division \n");
            fprintf(f, "        pop     de\n");
            fprintf(f, "        ld      e, a\n");
            fprintf(f, "        call    ___div_u8_\n");
            fprintf(f, "        ld      a, d\n");
            break;

        case '%':
            fprintf(f, "; modulo \n");
            fprintf(f, "        pop     de\n");
            fprintf(f, "        ld      e, a\n");
            fprintf(f, "        call    ___div_u8_\n");
            break;
        }
    }
    else if (node->type == ASSIGN)
    {
        gen_assign(node);
    }
}